

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

void deqp::gls::ub::anon_unknown_12::copyUniformData
               (UniformLayoutEntry *dstEntry,void *dstBlockPtr,UniformLayoutEntry *srcEntry,
               void *srcBlockPtr)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *dst;
  void *src;
  int local_94;
  int local_84;
  deUint8 *srcCompPtr;
  deUint8 *dstCompPtr;
  int rowNdx;
  int colNdx;
  int numCols;
  int numRows;
  deUint8 *srcElemPtr;
  deUint8 *dstElemPtr;
  int elementNdx;
  int compSize;
  bool isMatrix;
  int scalarSize;
  deUint8 *srcBasePtr;
  deUint8 *dstBasePtr;
  void *srcBlockPtr_local;
  UniformLayoutEntry *srcEntry_local;
  void *dstBlockPtr_local;
  UniformLayoutEntry *dstEntry_local;
  
  iVar1 = dstEntry->offset;
  iVar2 = srcEntry->offset;
  iVar4 = glu::getDataTypeScalarSize(dstEntry->type);
  bVar3 = glu::isDataTypeMatrix(dstEntry->type);
  for (dstElemPtr._0_4_ = 0; (int)dstElemPtr < dstEntry->size;
      dstElemPtr._0_4_ = (int)dstElemPtr + 1) {
    dst = (void *)((long)dstBlockPtr + (long)((int)dstElemPtr * dstEntry->arrayStride) + (long)iVar1
                  );
    src = (void *)((long)srcBlockPtr + (long)((int)dstElemPtr * srcEntry->arrayStride) + (long)iVar2
                  );
    if (bVar3) {
      iVar5 = glu::getDataTypeMatrixNumRows(dstEntry->type);
      iVar6 = glu::getDataTypeMatrixNumColumns(dstEntry->type);
      for (dstCompPtr._4_4_ = 0; dstCompPtr._4_4_ < iVar6; dstCompPtr._4_4_ = dstCompPtr._4_4_ + 1)
      {
        for (dstCompPtr._0_4_ = 0; (int)dstCompPtr < iVar5; dstCompPtr._0_4_ = (int)dstCompPtr + 1)
        {
          if ((dstEntry->isRowMajor & 1U) == 0) {
            local_84 = dstCompPtr._4_4_ * dstEntry->matrixStride + (int)dstCompPtr * 4;
          }
          else {
            local_84 = (int)dstCompPtr * dstEntry->matrixStride + dstCompPtr._4_4_ * 4;
          }
          if ((srcEntry->isRowMajor & 1U) == 0) {
            local_94 = dstCompPtr._4_4_ * srcEntry->matrixStride + (int)dstCompPtr * 4;
          }
          else {
            local_94 = (int)dstCompPtr * srcEntry->matrixStride + dstCompPtr._4_4_ * 4;
          }
          ::deMemcpy((void *)((long)dst + (long)local_84),(void *)((long)src + (long)local_94),4);
        }
      }
    }
    else {
      ::deMemcpy(dst,src,(long)(iVar4 << 2));
    }
  }
  return;
}

Assistant:

void copyUniformData (const UniformLayoutEntry& dstEntry, void* dstBlockPtr, const UniformLayoutEntry& srcEntry, const void* srcBlockPtr)
{
	deUint8*					dstBasePtr	= (deUint8*)dstBlockPtr + dstEntry.offset;
	const deUint8*				srcBasePtr	= (const deUint8*)srcBlockPtr + srcEntry.offset;

	DE_ASSERT(dstEntry.size <= srcEntry.size);
	DE_ASSERT(dstEntry.type == srcEntry.type);

	int							scalarSize	= glu::getDataTypeScalarSize(dstEntry.type);
	bool						isMatrix	= glu::isDataTypeMatrix(dstEntry.type);
	const int					compSize	= sizeof(deUint32);

	for (int elementNdx = 0; elementNdx < dstEntry.size; elementNdx++)
	{
		deUint8*		dstElemPtr	= dstBasePtr + elementNdx*dstEntry.arrayStride;
		const deUint8*	srcElemPtr	= srcBasePtr + elementNdx*srcEntry.arrayStride;

		if (isMatrix)
		{
			int	numRows	= glu::getDataTypeMatrixNumRows(dstEntry.type);
			int	numCols	= glu::getDataTypeMatrixNumColumns(dstEntry.type);

			for (int colNdx = 0; colNdx < numCols; colNdx++)
			{
				for (int rowNdx = 0; rowNdx < numRows; rowNdx++)
				{
					deUint8*		dstCompPtr	= dstElemPtr + (dstEntry.isRowMajor ? rowNdx*dstEntry.matrixStride + colNdx*compSize
																					: colNdx*dstEntry.matrixStride + rowNdx*compSize);
					const deUint8*	srcCompPtr	= srcElemPtr + (srcEntry.isRowMajor ? rowNdx*srcEntry.matrixStride + colNdx*compSize
																					: colNdx*srcEntry.matrixStride + rowNdx*compSize);
					deMemcpy(dstCompPtr, srcCompPtr, compSize);
				}
			}
		}
		else
			deMemcpy(dstElemPtr, srcElemPtr, scalarSize*compSize);
	}
}